

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O1

void __thiscall relive::ReLiveApp::savePosition(ReLiveApp *this)

{
  ReLiveDB *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  PlayerState PVar3;
  int iVar4;
  int64_t iVar5;
  Station *station;
  pointer this_01;
  string newPos;
  string dbPosition;
  string local_98;
  ReLiveDB *local_78;
  string local_70;
  string local_50;
  
  this_00 = &this->_rdb;
  paVar1 = &local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar1;
  ReLiveDB::getConfigValueString(&local_50,this_00,&Keys::play_position_abi_cxx11_,&local_98);
  local_78 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar1;
  PVar3 = Player::state(&this->_player);
  if ((PVar3 == eENDOFSTREAM) || (this->_activeTrack == 0)) {
    if (this->_activeStation != 0) {
      this_01 = (this->_stations).
                super__Vector_base<relive::Station,_std::allocator<relive::Station>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 = (this->_stations).
               super__Vector_base<relive::Station,_std::allocator<relive::Station>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (this_01 != pSVar2) {
        do {
          if (this->_activeStation == this_01->_id) {
            Station::reLiveURL_abi_cxx11_(&local_70,this_01);
            std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          this_01 = this_01 + 1;
        } while (this_01 != pSVar2);
      }
    }
  }
  else {
    iVar4 = Player::playTime(&this->_player);
    Track::reLiveURL_abi_cxx11_(&local_70,&this->_activeTrackInfo,(long)iVar4);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_98._M_string_length == 0) goto LAB_00118d5c;
  if (local_50._M_string_length == local_98._M_string_length) {
    if (local_50._M_string_length == 0) goto LAB_00118d5c;
    iVar4 = bcmp(local_50._M_dataplus._M_p,local_98._M_dataplus._M_p,local_50._M_string_length);
    if (iVar4 == 0) goto LAB_00118d5c;
  }
  ReLiveDB::setConfigValue<std::__cxx11::string>(local_78,&Keys::play_position_abi_cxx11_,&local_98)
  ;
LAB_00118d5c:
  iVar5 = currentTime();
  this->_lastSavepoint = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ReLiveApp::savePosition()
{
    auto dbPosition = _rdb.getConfigValue(Keys::play_position, std::string());
    std::string newPos;
    if (_player.state() != PlayerState::eENDOFSTREAM && _activeTrack) {
        newPos = _activeTrackInfo.reLiveURL(_player.playTime());
    }
    else if (_activeStation) {
        for (const auto& station : _stations) {
            if (_activeStation == station._id) {
                newPos = station.reLiveURL();
            }
        }
    }
    if(!newPos.empty() && dbPosition != newPos) {
        _rdb.setConfigValue(Keys::play_position, newPos);
    }
    _lastSavepoint = currentTime();
}